

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_0::AllSameBlocks::add
          (AllSameBlocks *this,int32_t index,int32_t count,uint32_t value)

{
  int local_28;
  int local_24;
  int32_t i;
  int32_t leastCount;
  int32_t least;
  uint32_t value_local;
  int32_t count_local;
  int32_t index_local;
  AllSameBlocks *this_local;
  
  i = -1;
  local_24 = 0x11000;
  for (local_28 = 0; local_28 < this->length; local_28 = local_28 + 1) {
    if (this->refCounts[local_28] < local_24) {
      i = local_28;
      local_24 = this->refCounts[local_28];
    }
  }
  this->mostRecent = i;
  this->indexes[i] = index;
  this->values[i] = value;
  this->refCounts[i] = count;
  return;
}

Assistant:

void add(int32_t index, int32_t count, uint32_t value) {
        U_ASSERT(length == CAPACITY);
        int32_t least = -1;
        int32_t leastCount = I_LIMIT;
        for (int32_t i = 0; i < length; ++i) {
            U_ASSERT(values[i] != value);
            if (refCounts[i] < leastCount) {
                least = i;
                leastCount = refCounts[i];
            }
        }
        U_ASSERT(least >= 0);
        mostRecent = least;
        indexes[least] = index;
        values[least] = value;
        refCounts[least] = count;
    }